

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O3

bool __thiscall
WriterTestHelper<unsigned_char,_3U,_32849U>::compareRawImages
          (WriterTestHelper<unsigned_char,_3U,_32849U> *this,ktx_uint8_t *pData)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ktx_uint32_t kVar5;
  pointer pvVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  size_t __n;
  ktx_uint8_t *pImage;
  ulong uVar19;
  ulong uVar20;
  void *__s1;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  
  uVar14 = (ulong)this->numLevels;
  if (uVar14 == 0) {
    bVar23 = true;
  }
  else {
    uVar2 = this->width;
    uVar3 = this->height;
    uVar4 = this->depth;
    uVar18 = (ulong)this->numLayers;
    kVar5 = this->numFaces;
    pvVar6 = (this->images).
             super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar1 = this->isArray;
    uVar13 = 0;
    bVar23 = false;
    do {
      bVar11 = (byte)uVar13;
      uVar17 = uVar2 >> (bVar11 & 0x1f);
      __n = (ulong)uVar17 * 3;
      if (uVar17 == 0) {
        __n = 3;
      }
      uVar17 = uVar3 >> (bVar11 & 0x1f);
      uVar19 = (ulong)(uVar17 + (uVar17 == 0));
      uVar17 = uVar4 >> (bVar11 & 0x1f);
      uVar17 = uVar17 + (uVar17 == 0);
      uVar12 = (int)__n - 1U & 3;
      lVar22 = (uVar12 ^ 3) + __n;
      uVar20 = uVar19 * lVar22;
      if (kVar5 == 6) {
        uVar17 = 6;
      }
      uVar21 = (ulong)uVar17;
      uVar10 = uVar21 * uVar18 * uVar20;
      if (kVar5 == 6 && (bVar1 & 1U) == 0) {
        uVar10 = uVar20;
      }
      if (uVar10 != *(uint *)pData) {
        return bVar23;
      }
      pData = (ktx_uint8_t *)((long)pData + 4);
      if (uVar18 != 0) {
        if (kVar5 == 6 && (bVar1 & 1U) == 0) {
          uVar21 = 6;
        }
        lVar7 = *(long *)&pvVar6[uVar13].
                          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        uVar10 = 0;
        do {
          lVar8 = *(long *)(lVar7 + uVar10 * 0x18);
          uVar16 = 0;
          do {
            __s1 = *(void **)(lVar8 + uVar16 * 0x18);
            uVar15 = uVar19;
            if (uVar12 == 3) {
              iVar9 = bcmp(__s1,pData,*(long *)(lVar8 + uVar16 * 0x18 + 8) - (long)__s1);
              if (iVar9 != 0) {
                return bVar23;
              }
              pData = (ktx_uint8_t *)((long)pData + uVar20);
            }
            else {
              do {
                iVar9 = bcmp(__s1,pData,__n);
                if (iVar9 != 0) {
                  return bVar23;
                }
                __s1 = (void *)((long)__s1 + __n);
                pData = (ktx_uint8_t *)((long)pData + lVar22);
                uVar17 = (int)uVar15 - 1;
                uVar15 = (ulong)uVar17;
              } while (uVar17 != 0);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar21);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar18);
      }
      uVar13 = uVar13 + 1;
      bVar23 = uVar14 <= uVar13;
    } while (uVar13 != uVar14);
  }
  return bVar23;
}

Assistant:

bool compareRawImages(ktx_uint8_t* pData) {
        for (ktx_uint32_t level = 0; level < numLevels; level++) {
            ktx_uint32_t faceLodSize = *(ktx_uint32_t*)pData;
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_uint32_t levelDepth = MAX(1, depth >> level);
            ktx_uint32_t numImages;
            ktx_uint32_t rowPadding;
            ktx_size_t paddedImageBytes;
            ktx_size_t paddedRowBytes, rowBytes;
            ktx_size_t expectedFaceLodSize;

            rowBytes = levelWidth
                            * sizeof(component_type)
                            * numComponents;
            rowPadding = 3 - ((rowBytes + KTX_GL_UNPACK_ALIGNMENT-1) % KTX_GL_UNPACK_ALIGNMENT);
            paddedRowBytes = rowBytes + rowPadding;
            paddedImageBytes = paddedRowBytes * levelHeight;
            if (numFaces == 6 && !isArray) {
                // Non-array cubemap.
                numImages = numFaces;
                expectedFaceLodSize = paddedImageBytes;
            } else {
                numImages = numFaces == 6 ? numFaces : levelDepth;
                expectedFaceLodSize = paddedImageBytes * numImages * numLayers;
            }
            if (faceLodSize != expectedFaceLodSize)
               return false;
            pData += sizeof(ktx_uint32_t);
            for (ktx_uint32_t layer = 0; layer < numLayers; layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < numImages; faceSlice++) {
                    if (rowPadding == 0) {
                        if (memcmp(images[level][layer][faceSlice].data(),
                                   pData,
                                   images[level][layer][faceSlice].size() * sizeof(component_type)))
                            return false;
                        pData += paddedImageBytes;
                    } else {
                        ktx_uint8_t* pImage = (ktx_uint8_t*)images[level][layer][faceSlice].data();
                        for (ktx_uint32_t row = 0; row < levelHeight; row++) {
                            if (memcmp(pImage, pData, rowBytes))
                                return false;
                            pImage += rowBytes;
                            pData += paddedRowBytes;
                        }
                    }
                }
            }
        }
        return true;
    }